

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvector-generator.cpp
# Opt level: O0

void __thiscall callback_data::save_tensor_for_layer(callback_data *this,ggml_tensor *t)

{
  long lVar1;
  size_t __size;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *this_00;
  pointer ppgVar2;
  undefined8 uVar3;
  int *in_RSI;
  long *in_RDI;
  ggml_tensor *t_layer;
  size_t n_bytes;
  ggml_init_params params_ggml;
  value_type *in_stack_ffffffffffffff98;
  undefined7 uStack_17;
  
  if (*in_RSI != 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/cvector-generator/cvector-generator.cpp"
               ,0x45,"GGML_ASSERT(%s) failed","t->type == GGML_TYPE_F32");
  }
  if (*in_RDI == 0) {
    ggml_tensor_overhead();
    in_stack_ffffffffffffff98 = (value_type *)CONCAT71(uStack_17,1);
    lVar1 = ggml_init();
    *in_RDI = lVar1;
  }
  __size = ggml_nbytes(in_RSI);
  this_00 = (vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)
            ggml_new_tensor_2d(*in_RDI,*in_RSI,*(undefined8 *)(in_RSI + 4),
                               *(undefined8 *)(in_RSI + 6));
  ppgVar2 = (pointer)malloc(__size);
  this_00[10].super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppgVar2;
  ggml_backend_tensor_get
            (in_RSI,this_00[10].super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish,0,__size);
  uVar3 = ggml_get_name(in_RSI);
  ggml_set_name(this_00,uVar3);
  if ((*(byte *)(in_RDI + 2) & 1) == 0) {
    std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::push_back
              (this_00,in_stack_ffffffffffffff98);
  }
  else {
    std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::push_back
              (this_00,in_stack_ffffffffffffff98);
  }
  return;
}

Assistant:

void save_tensor_for_layer(struct ggml_tensor * t) {
        GGML_ASSERT(t->type == GGML_TYPE_F32);

        if (ctx_ggml == nullptr) {
            // alloc a new ctx_ggml if needed
            struct ggml_init_params params_ggml = {
                /*.mem_size   =*/ ggml_tensor_overhead() * n_layers * 3u,
                /*.mem_buffer =*/ NULL,
                /*.no_alloc   =*/ true,
            };
            ctx_ggml = ggml_init(params_ggml);
        }

        // copy tensor data
        auto n_bytes = ggml_nbytes(t);
        struct ggml_tensor * t_layer = ggml_new_tensor_2d(ctx_ggml, t->type, t->ne[0], t->ne[1]);
        t_layer->data = malloc(n_bytes); // TODO @ngxson : get rid of this malloc somehow
        ggml_backend_tensor_get(t, t_layer->data, 0, n_bytes);
        ggml_set_name(t_layer, ggml_get_name(t));
        //print_debug_tensor(t_layer);

        if (is_eval_pos) {
            v_pos.push_back(t_layer);
        } else {
            v_neg.push_back(t_layer);
        }
    }